

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMem.c
# Opt level: O2

void Hop_ManStopMemory(Hop_Man_t *p)

{
  Vec_Ptr_t *p_00;
  int i;
  long lVar1;
  
  for (lVar1 = 0; p_00 = p->vChunks, lVar1 < p_00->nSize; lVar1 = lVar1 + 1) {
    free(p_00->pArray[lVar1]);
  }
  Vec_PtrFree(p_00);
  Vec_PtrFree(p->vPages);
  p->pListFree = (Hop_Obj_t *)0x0;
  return;
}

Assistant:

void Hop_ManStopMemory( Hop_Man_t * p )
{
    void * pMemory;
    int i;
    Vec_PtrForEachEntry( void *, p->vChunks, pMemory, i )
        ABC_FREE( pMemory );
    Vec_PtrFree( p->vChunks );
    Vec_PtrFree( p->vPages );
    p->pListFree = NULL;
}